

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xml2_read_toc(archive_read *a)

{
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  size_t len;
  int empty;
  int type;
  char *value;
  char *name;
  undefined1 local_30 [4];
  int r;
  xmlattr_list list;
  xmlTextReaderPtr reader;
  archive_read *a_local;
  
  list.last = (xmlattr **)xmlReaderForIO(xml2_read_cb,xml2_close_cb,a,0,0,0);
  if (list.last == (xmlattr **)0x0) {
    archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory for xml parser");
    a_local._4_4_ = -0x1e;
  }
  else {
    xmlTextReaderSetErrorHandler(list.last,xml2_error_hdr,a);
    do {
      name._4_4_ = xmlTextReaderRead(list.last);
      if (name._4_4_ != 1) break;
      uVar1 = xmlTextReaderNodeType(list.last);
      pcVar3 = (char *)xmlTextReaderConstLocalName(list.last);
      switch(uVar1) {
      case 1:
        iVar2 = xmlTextReaderIsEmptyElement(list.last);
        name._4_4_ = xml2_xmlattr_setup(a,(xmlattr_list *)local_30,(xmlTextReaderPtr)list.last);
        if (name._4_4_ == 0) {
          name._4_4_ = xml_start(a,pcVar3,(xmlattr_list *)local_30);
        }
        xmlattr_cleanup((xmlattr_list *)local_30);
        if (name._4_4_ != 0) {
          xmlFreeTextReader(list.last);
          xmlCleanupParser();
          return name._4_4_;
        }
        if (iVar2 != 0) {
          xml_end(a,pcVar3);
        }
        break;
      case 3:
        pcVar3 = (char *)xmlTextReaderConstValue(list.last);
        len = strlen(pcVar3);
        xml_data(a,pcVar3,len);
        break;
      case 0xe:
      default:
        break;
      case 0xf:
        xml_end(a,pcVar3);
      }
    } while (-1 < name._4_4_);
    xmlFreeTextReader(list.last);
    xmlCleanupParser();
    a_local._4_4_ = -0x1e;
    if (name._4_4_ == 0) {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
xml2_read_toc(struct archive_read *a)
{
	xmlTextReaderPtr reader;
	struct xmlattr_list list;
	int r;

	reader = xmlReaderForIO(xml2_read_cb, xml2_close_cb, a, NULL, NULL, 0);
	if (reader == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Couldn't allocate memory for xml parser");
		return (ARCHIVE_FATAL);
	}
	xmlTextReaderSetErrorHandler(reader, xml2_error_hdr, a);

	while ((r = xmlTextReaderRead(reader)) == 1) {
		const char *name, *value;
		int type, empty;

		type = xmlTextReaderNodeType(reader);
		name = (const char *)xmlTextReaderConstLocalName(reader);
		switch (type) {
		case XML_READER_TYPE_ELEMENT:
			empty = xmlTextReaderIsEmptyElement(reader);
			r = xml2_xmlattr_setup(a, &list, reader);
			if (r == ARCHIVE_OK)
				r = xml_start(a, name, &list);
			xmlattr_cleanup(&list);
			if (r != ARCHIVE_OK) {
				xmlFreeTextReader(reader);
				xmlCleanupParser();
				return (r);
			}
			if (empty)
				xml_end(a, name);
			break;
		case XML_READER_TYPE_END_ELEMENT:
			xml_end(a, name);
			break;
		case XML_READER_TYPE_TEXT:
			value = (const char *)xmlTextReaderConstValue(reader);
			xml_data(a, value, strlen(value));
			break;
		case XML_READER_TYPE_SIGNIFICANT_WHITESPACE:
		default:
			break;
		}
		if (r < 0)
			break;
	}
	xmlFreeTextReader(reader);
	xmlCleanupParser();

	return ((r == 0)?ARCHIVE_OK:ARCHIVE_FATAL);
}